

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::detail::
assert_result_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (detail *this,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db,
          key_type key,value_view expected,char *file,int line)

{
  quiescent_state_on_scope_exit aqVar1 [2];
  undefined4 uVar2;
  quiescent_state_on_scope_exit local_38 [2];
  quiescent_state_on_scope_exit local_34 [2];
  quiescent_state_on_scope_exit qsbr_after_get;
  
  local_38 = (quiescent_state_on_scope_exit  [2])((ulong)file & 0xffffffff);
  uVar2 = std::uncaught_exceptions();
  aqVar1 = local_38;
  local_38[1].exceptions_at_ctor = uVar2;
  do_assert_result_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            (this,db,key,expected,(char *)((ulong)aqVar1 & 0xffffffff),
             local_38[0].exceptions_at_ctor);
  quiescent_state_on_scope_exit::~quiescent_state_on_scope_exit
            ((quiescent_state_on_scope_exit *)((long)register0x00000020 + -0x34));
  return;
}

Assistant:

void assert_result_eq(const Db &db, typename Db::key_type key,
                      unodb::value_view expected, const char *file, int line) {
  if constexpr (is_olc_db<Db>) {
    const quiescent_state_on_scope_exit qsbr_after_get{};
    do_assert_result_eq<Db>(db, key, expected, file, line);
  } else {
    do_assert_result_eq<Db>(db, key, expected, file, line);
  }
}